

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

int armci_msg_rcvany(int tag,void *buffer,int len,int *msglen)

{
  int iVar1;
  MPI_Comm poVar2;
  int flag;
  MPI_Request request;
  int rank;
  MPI_Status status;
  int local_54;
  undefined1 local_50 [12];
  undefined1 local_44 [4];
  int local_40 [6];
  
  poVar2 = wc();
  local_54 = 0;
  iVar1 = MPI_Comm_rank(poVar2,local_44);
  if (iVar1 != 0) {
    __assert_fail("MPI_SUCCESS == rc",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                  ,0x1b9,"int armci_msg_rcvany(int, void *, int, int *)");
  }
  if (tag != 0x6be8) {
    poVar2 = wc();
    iVar1 = MPI_Irecv(buffer,len,&ompi_mpi_char,0xffffffff,tag,poVar2,local_50);
    if (iVar1 != 0) {
      __assert_fail("MPI_SUCCESS == rc",
                    "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                    ,0x1be,"int armci_msg_rcvany(int, void *, int, int *)");
    }
    MPI_Test(local_50,&local_54,local_40);
    comex_make_progress();
    if (local_54 == 0) {
      do {
        MPI_Test(local_50,&local_54,local_40);
        comex_make_progress();
      } while (local_54 == 0);
    }
    if (msglen != (int *)0x0) {
      iVar1 = MPI_Get_count(local_40,&ompi_mpi_char,msglen);
      if (iVar1 != 0) {
        __assert_fail("MPI_SUCCESS == rc",
                      "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                      ,0x1c9,"int armci_msg_rcvany(int, void *, int, int *)");
      }
    }
    return local_40[0];
  }
  __assert_fail("COMEX_TAG != tag",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                ,0x1bb,"int armci_msg_rcvany(int, void *, int, int *)");
}

Assistant:

int armci_msg_rcvany(int tag, void* buffer, int len, int *msglen)
{
    MPI_Comm comm = wc();
    MPI_Request request;
    MPI_Status status;
    int rank;
    int flag = 0;
    int rc;

    rc = MPI_Comm_rank(comm, &rank);
    assert(MPI_SUCCESS == rc);
#if COMEX_NETWORK_MPI_TS
    assert(COMEX_TAG != tag);
#endif
    rc = MPI_Irecv(buffer, len, MPI_CHAR, MPI_ANY_SOURCE, tag, wc(), &request);
    assert(MPI_SUCCESS == rc);
    do {
        MPI_Test(&request, &flag, &status);
        assert(MPI_SUCCESS == rc);
#if COMEX_NETWORK_MPI_TS
        comex_make_progress();
#endif
    } while (!flag);

    if(msglen) {
        rc = MPI_Get_count(&status, MPI_CHAR, msglen);
        assert(MPI_SUCCESS == rc);
    }

    return (int)status.MPI_SOURCE;
}